

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

bool QFileSystemEngine::createLink
               (QFileSystemEntry *source,QFileSystemEntry *target,QSystemError *error)

{
  bool bVar1;
  int iVar2;
  char *__from;
  char *__to;
  int *piVar3;
  QSystemError *in_RDX;
  long in_FS_OFFSET;
  QFileSystemEntry *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  bool local_c1;
  QSystemError local_c0 [23];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QFileSystemEntry::isEmpty(in_stack_ffffffffffffff10);
  if (bVar1) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    local_c1 = false;
  }
  else {
    bVar1 = qIsFilenameBroken(in_stack_ffffffffffffff10);
    if (bVar1) {
      piVar3 = __errno_location();
      *piVar3 = 0x16;
      local_c1 = false;
    }
    else {
      bVar1 = QFileSystemEntry::isEmpty(in_stack_ffffffffffffff10);
      if (bVar1) {
        piVar3 = __errno_location();
        *piVar3 = 0x16;
        local_c1 = false;
      }
      else {
        bVar1 = qIsFilenameBroken(in_stack_ffffffffffffff10);
        if (bVar1) {
          piVar3 = __errno_location();
          *piVar3 = 0x16;
          local_c1 = false;
        }
        else {
          QFileSystemEntry::nativeFilePath
                    ((QFileSystemEntry *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          __from = QByteArray::constData((QByteArray *)0x212434);
          QFileSystemEntry::nativeFilePath
                    ((QFileSystemEntry *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          __to = QByteArray::constData((QByteArray *)0x212452);
          iVar2 = symlink(__from,__to);
          QByteArray::~QByteArray((QByteArray *)0x21246d);
          QByteArray::~QByteArray((QByteArray *)0x212477);
          if (iVar2 == 0) {
            local_c1 = true;
          }
          else {
            piVar3 = __errno_location();
            QSystemError::QSystemError(local_c0,*piVar3,StandardLibraryError);
            *in_RDX = local_c0[0];
            local_c1 = false;
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_c1;
}

Assistant:

bool QFileSystemEngine::createLink(const QFileSystemEntry &source, const QFileSystemEntry &target, QSystemError &error)
{
    Q_CHECK_FILE_NAME(source, false);
    Q_CHECK_FILE_NAME(target, false);

    if (::symlink(source.nativeFilePath().constData(), target.nativeFilePath().constData()) == 0)
        return true;
    error = QSystemError(errno, QSystemError::StandardLibraryError);
    return false;
}